

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h265d_parser2_syntax.c
# Opt level: O1

RK_S32 h265d_syntax_fill_slice(void *ctx,RK_S32 input_index)

{
  undefined4 uVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  RK_S32 index;
  undefined2 *puVar5;
  size_t sVar6;
  void *pvVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  undefined2 *puVar11;
  long lVar12;
  long lVar13;
  RK_S32 _out;
  RK_U32 nal_type;
  MppBuffer streambuf;
  BitReadCtx_t gb_cxt;
  uint local_cc;
  ulong local_c8;
  RK_S32 local_bc;
  int local_b8;
  uint local_b4;
  undefined2 *local_b0;
  long local_a8;
  ulong local_a0;
  undefined2 *local_98;
  MppBuffer local_90;
  BitReadCtx_t local_88;
  
  lVar2 = *ctx;
  lVar12 = *(long *)(lVar2 + 0x25730);
  local_90 = (MppBuffer)0x0;
  if (input_index == -1) {
    puVar5 = (undefined2 *)mpp_packet_get_data(*(MppPacket *)(lVar2 + 0x25728));
    sVar6 = mpp_packet_get_size(*(MppPacket *)(lVar2 + 0x25728));
    if ((long)*(int *)(lVar2 + 0x1150) < 1) {
      uVar10 = 0;
    }
    else {
      lVar13 = 0;
      iVar9 = 0;
      do {
        iVar8 = iVar9 + *(int *)(*(long *)(lVar2 + 0x1148) + 0xc + lVar13);
        iVar9 = iVar8 + 4;
        lVar13 = lVar13 + 0x18;
      } while ((long)*(int *)(lVar2 + 0x1150) * 0x18 != lVar13);
      uVar10 = iVar8 + 0x13U & 0xfffffff0;
    }
    if ((uint)sVar6 < uVar10 + 0x40) {
      mpp_osal_free("h265d_syntax_fill_slice",puVar5);
      sVar6 = (size_t)(int)(uVar10 + 0x2c3f & 0xfffffc00);
      puVar5 = (undefined2 *)mpp_osal_malloc("h265d_syntax_fill_slice",sVar6);
      mpp_packet_set_data(*(MppPacket *)(lVar2 + 0x25728),puVar5);
      mpp_packet_set_size(*(MppPacket *)(lVar2 + 0x25728),sVar6);
    }
    puVar11 = (undefined2 *)0x0;
  }
  else {
    mpp_buf_slot_get_prop(*(MppBufSlots *)(lVar2 + 0x25718),input_index,SLOT_BUFFER,&local_90);
    puVar5 = (undefined2 *)mpp_buffer_get_ptr_with_caller(local_90,"h265d_syntax_fill_slice");
    puVar11 = puVar5;
    if (puVar5 == (undefined2 *)0x0) {
      return -3;
    }
  }
  if (*(int *)(lVar12 + 0x1e78) < *(int *)(lVar2 + 0x1150)) {
    if (*(void **)(lVar12 + 0x1e58) != (void *)0x0) {
      mpp_osal_free("h265d_syntax_fill_slice",*(void **)(lVar12 + 0x1e58));
    }
    *(undefined8 *)(lVar12 + 0x1e58) = 0;
    pvVar7 = mpp_osal_malloc("h265d_syntax_fill_slice",(long)*(int *)(lVar2 + 0x1150) * 0xc);
    *(void **)(lVar12 + 0x1e58) = pvVar7;
    if (pvVar7 == (void *)0x0) {
      return -0x3ee;
    }
    if (*(void **)(lVar12 + 0x1e70) != (void *)0x0) {
      mpp_osal_free("h265d_syntax_fill_slice",*(void **)(lVar12 + 0x1e70));
    }
    *(undefined8 *)(lVar12 + 0x1e70) = 0;
    pvVar7 = mpp_osal_malloc("h265d_syntax_fill_slice",(long)*(int *)(lVar2 + 0x1150) * 0xc);
    *(void **)(lVar12 + 0x1e70) = pvVar7;
    if (pvVar7 == (void *)0x0) {
      return -0x3ee;
    }
    *(undefined4 *)(lVar12 + 0x1e78) = *(undefined4 *)(lVar2 + 0x1150);
  }
  local_bc = input_index;
  local_a8 = lVar12;
  local_98 = puVar11;
  if (*(int *)(lVar2 + 0x1150) < 1) {
    local_c8 = 0;
    sVar6 = 0;
  }
  else {
    lVar12 = 0;
    lVar13 = 0;
    sVar6 = 0;
    local_c8 = 0;
    local_b0 = puVar5;
    do {
      mpp_set_bitread_ctx(&local_88,*(RK_U8 **)(*(long *)(lVar2 + 0x1148) + 0x10 + lVar12),
                          *(RK_S32 *)(*(long *)(lVar2 + 0x1148) + 0xc + lVar12));
      mpp_set_bitread_pseudo_code_type(&local_88,PSEUDO_CODE_H264_H265);
      local_88.ret = mpp_read_bits(&local_88,1,(RK_S32 *)&local_cc);
      iVar9 = 0xe;
      if (local_88.ret == MPP_OK) {
        local_88.ret = mpp_read_bits(&local_88,6,(RK_S32 *)&local_cc);
        puVar5 = local_b0;
        iVar9 = 0xe;
        if (local_88.ret == MPP_OK) {
          local_b4 = local_cc;
          iVar9 = 0xb;
          if (local_cc < 0x20) {
            *local_b0 = 0;
            *(undefined1 *)(local_b0 + 1) = 1;
            local_b8 = (int)sVar6 + 3;
            local_a0 = sVar6;
            memcpy((void *)((long)local_b0 + 3),
                   *(void **)(*(long *)(lVar2 + 0x1148) + 0x10 + lVar12),
                   (long)*(int *)(*(long *)(lVar2 + 0x1148) + 0xc + lVar12));
            lVar3 = *(long *)(local_a8 + 0x1e58);
            lVar4 = (long)(int)local_c8 * 0xc;
            uVar1 = *(undefined4 *)(*(long *)(lVar2 + 0x1148) + 0xc + lVar12);
            *(undefined8 *)(lVar3 + lVar4) = 0;
            iVar9 = 0;
            *(undefined4 *)(lVar3 + 8 + lVar4) = 0;
            *(int *)(lVar3 + lVar4) = local_b8;
            *(undefined4 *)(lVar3 + 4 + lVar4) = uVar1;
            *(undefined2 *)(lVar3 + 8 + lVar4) = 0;
            lVar3 = *(long *)(local_a8 + 0x1e70);
            *(undefined8 *)(lVar3 + lVar4) = 0;
            *(undefined4 *)(lVar3 + 8 + lVar4) = 0;
            iVar8 = *(int *)(*(long *)(lVar2 + 0x1148) + 0xc + lVar12);
            local_b0 = (undefined2 *)((long)puVar5 + (long)iVar8 + 3);
            sVar6 = (size_t)((int)local_a0 + iVar8 + 3);
            local_c8 = (ulong)((int)local_c8 + 1);
          }
        }
      }
      if ((iVar9 != 0xb) && (iVar9 != 0)) {
        return -0x3ec;
      }
      lVar13 = lVar13 + 1;
      lVar12 = lVar12 + 0x18;
    } while (lVar13 < *(int *)(lVar2 + 0x1150));
  }
  index = local_bc;
  *(int *)(local_a8 + 0x1e54) = (int)local_c8;
  *(int *)(local_a8 + 0x1e68) = (int)sVar6;
  if (local_bc == -1) {
    *(undefined8 *)(local_a8 + 0x1e60) = 0;
    mpp_packet_set_length(*(MppPacket *)(lVar2 + 0x25728),sVar6);
  }
  else {
    *(undefined2 **)(local_a8 + 0x1e60) = local_98;
    mpp_buf_slot_set_flag(*(MppBufSlots *)(lVar2 + 0x25718),local_bc,SLOT_CODEC_READY);
    mpp_buf_slot_set_flag(*(MppBufSlots *)(lVar2 + 0x25718),index,SLOT_HAL_INPUT);
  }
  return 0;
}

Assistant:

RK_S32 h265d_syntax_fill_slice(void *ctx, RK_S32 input_index)
{
    H265dContext_t *h265dctx = (H265dContext_t *)ctx;
    const HEVCContext *h = (const HEVCContext *)h265dctx->priv_data;
    h265d_dxva2_picture_context_t *ctx_pic = (h265d_dxva2_picture_context_t *)h->hal_pic_private;
    MppBuffer streambuf = NULL;
    RK_S32 i, count = 0;
    RK_U32 position = 0;
    RK_U8 *ptr = NULL;
    RK_U8 *current = NULL;
    RK_U32 size = 0, length = 0;
    // mpp_err("input_index = %d",input_index);
    if (-1 != input_index) {
        mpp_buf_slot_get_prop(h->packet_slots, input_index, SLOT_BUFFER, &streambuf);
        current = ptr = (RK_U8 *)mpp_buffer_get_ptr(streambuf);
        if (current == NULL) {
            return MPP_ERR_NULL_PTR;
        }
    } else {
        RK_S32 buff_size = 0;
        current = (RK_U8 *)mpp_packet_get_data(h->input_packet);
        size = (RK_U32)mpp_packet_get_size(h->input_packet);
        for (i = 0; i < h->nb_nals; i++) {
            length += h->nals[i].size + 4;
        }
        length = MPP_ALIGN(length, 16) + 64;
        if (length > size) {
            mpp_free(current);
            buff_size = MPP_ALIGN(length + 10 * 1024, 1024);
            current = mpp_malloc(RK_U8, buff_size);
            mpp_packet_set_data(h->input_packet, (void*)current);
            mpp_packet_set_size(h->input_packet, buff_size);
        }
    }
    if (ctx_pic->max_slice_num < h->nb_nals) {

        MPP_FREE(ctx_pic->slice_short);

        ctx_pic->slice_short = (DXVA_Slice_HEVC_Short *)mpp_malloc(DXVA_Slice_HEVC_Short, h->nb_nals);
        if (!ctx_pic->slice_short)
            return MPP_ERR_NOMEM;

        MPP_FREE(ctx_pic->slice_cut_param);

        ctx_pic->slice_cut_param = (DXVA_Slice_HEVC_Cut_Param *)mpp_malloc(DXVA_Slice_HEVC_Cut_Param, h->nb_nals);
        if (!ctx_pic->slice_cut_param)
            return MPP_ERR_NOMEM;

        ctx_pic->max_slice_num = h->nb_nals;
    }
    for (i = 0; i < h->nb_nals; i++) {
        static const RK_U8 start_code[] = {0, 0, 1 };
        static const RK_U32 start_code_size = sizeof(start_code);
        BitReadCtx_t gb_cxt, *gb;
        RK_S32 value;
        RK_U32 nal_type;

        mpp_set_bitread_ctx(&gb_cxt, (RK_U8 *)h->nals[i].data,
                            h->nals[i].size);
        mpp_set_bitread_pseudo_code_type(&gb_cxt, PSEUDO_CODE_H264_H265);

        gb = &gb_cxt;

        READ_ONEBIT(gb, &value); /*this bit should be zero*/

        READ_BITS(gb, 6, &nal_type);

        if (nal_type >= 32) {
            continue;
        }
        memcpy(current, start_code, start_code_size);
        current += start_code_size;
        position += start_code_size;
        memcpy(current, h->nals[i].data, h->nals[i].size);
        // mpp_log("h->nals[%d].size = %d", i, h->nals[i].size);
        fill_slice_short(&ctx_pic->slice_short[count], position, h->nals[i].size);
        init_slice_cut_param(&ctx_pic->slice_cut_param[count]);
        current += h->nals[i].size;
        position += h->nals[i].size;
        count++;
    }
    ctx_pic->slice_count    = count;
    ctx_pic->bitstream_size = position;
    if (-1 != input_index) {
        ctx_pic->bitstream      = (RK_U8*)ptr;

        mpp_buf_slot_set_flag(h->packet_slots, input_index, SLOT_CODEC_READY);
        mpp_buf_slot_set_flag(h->packet_slots, input_index, SLOT_HAL_INPUT);
    } else {
        ctx_pic->bitstream = NULL;
        mpp_packet_set_length(h->input_packet, position);
    }
    return MPP_OK;
__BITREAD_ERR:
    return  MPP_ERR_STREAM;
}